

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

WebPEncodingError PutVP8XHeader(VP8Encoder *enc)

{
  int iVar1;
  long in_RDI;
  uint32_t flags;
  uint8_t vp8x [18];
  WebPPicture *pic;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined8 local_38;
  undefined8 local_30;
  undefined2 local_28;
  long local_18;
  WebPEncodingError local_4;
  
  local_18 = *(long *)(in_RDI + 8);
  local_38 = 0x58385056;
  local_30 = 0;
  local_28 = 0;
  uVar2 = 0;
  if (*(int *)(in_RDI + 0x21c) != 0) {
    uVar2 = 0x10;
  }
  PutLE32((uint8_t *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  PutLE32((uint8_t *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  PutLE24((uint8_t *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  PutLE24((uint8_t *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  iVar1 = (**(code **)(local_18 + 0x60))(&local_38,0x12,local_18);
  if (iVar1 == 0) {
    local_4 = VP8_ENC_ERROR_BAD_WRITE;
  }
  else {
    local_4 = VP8_ENC_OK;
  }
  return local_4;
}

Assistant:

static WebPEncodingError PutVP8XHeader(const VP8Encoder* const enc) {
  const WebPPicture* const pic = enc->pic_;
  uint8_t vp8x[CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE] = {
    'V', 'P', '8', 'X'
  };
  uint32_t flags = 0;

  assert(IsVP8XNeeded(enc));
  assert(pic->width >= 1 && pic->height >= 1);
  assert(pic->width <= MAX_CANVAS_SIZE && pic->height <= MAX_CANVAS_SIZE);

  if (enc->has_alpha_) {
    flags |= ALPHA_FLAG;
  }

  PutLE32(vp8x + TAG_SIZE,              VP8X_CHUNK_SIZE);
  PutLE32(vp8x + CHUNK_HEADER_SIZE,     flags);
  PutLE24(vp8x + CHUNK_HEADER_SIZE + 4, pic->width - 1);
  PutLE24(vp8x + CHUNK_HEADER_SIZE + 7, pic->height - 1);
  if (!pic->writer(vp8x, sizeof(vp8x), pic)) {
    return VP8_ENC_ERROR_BAD_WRITE;
  }
  return VP8_ENC_OK;
}